

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::showChildren(QWidgetPrivate *this,bool spontaneous)

{
  byte bVar1;
  bool bVar2;
  QWidget *pQVar3;
  QWidgetPrivate *pQVar4;
  qsizetype qVar5;
  QWidget *this_00;
  QDebug *pQVar6;
  QWindow *pQVar7;
  byte in_SIL;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidget *widget;
  int i;
  QWidget *q;
  QShowEvent e;
  QList<QObject_*> childList;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_fffffffffffffef0;
  QMessageLogger *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  int iVar8;
  undefined7 in_stack_ffffffffffffff18;
  QWidgetPrivate *attributes;
  QDebug *in_stack_ffffffffffffff28;
  QWidget *in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff53;
  WidgetAttribute in_stack_ffffffffffffff54;
  QWidget *in_stack_ffffffffffffff58;
  QDebug local_a0;
  QDebug in_stack_ffffffffffffff68;
  QDebug in_stack_ffffffffffffff70;
  QDebug local_88;
  QDebug local_80;
  QList<QObject_*> local_78 [2];
  QDebug local_40;
  QDebug local_38;
  QDebug local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_SIL & 1;
  attributes = in_RDI;
  pQVar3 = q_func(in_RDI);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::lcWidgetShowHide();
  anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            (in_stack_fffffffffffffef0,
             (QLoggingCategory *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_18), bVar2) {
    anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x378df4);
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff00,(char *)in_RDI,
               (int)((ulong)in_stack_fffffffffffffef0 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
               (char *)0x378e0d);
    QMessageLogger::debug();
    pQVar6 = QDebug::operator<<((QDebug *)
                                CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                                (char *)in_stack_ffffffffffffff38);
    QDebug::QDebug(&local_38,pQVar6);
    ::operator<<((QDebug *)in_stack_ffffffffffffff70.stream,
                 (QWidget *)in_stack_ffffffffffffff68.stream);
    QDebug::operator<<((QDebug *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                       (char *)in_stack_ffffffffffffff38);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffef0,(bool)in_stack_fffffffffffffeef);
    QDebug::~QDebug(&local_30);
    QDebug::~QDebug(&local_38);
    QDebug::~QDebug(&local_40);
    local_10 = 0;
  }
  local_78[0].d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78[0].d.ptr = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
  local_78[0].d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QObject_*>::QList
            ((QList<QObject_*> *)in_stack_fffffffffffffef0,
             (QList<QObject_*> *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  iVar8 = 0;
  while( true ) {
    pQVar4 = (QWidgetPrivate *)(long)iVar8;
    qVar5 = QList<QObject_*>::size(local_78);
    if (qVar5 <= (long)pQVar4) break;
    QList<QObject_*>::at
              ((QList<QObject_*> *)pQVar4,
               CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
    this_00 = qobject_cast<QWidget*>
                        ((QObject *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
    if (this_00 != (QWidget *)0x0) {
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcWidgetShowHide();
      anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)pQVar4,
                 (QLoggingCategory *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
      while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_28), bVar2) {
        anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x378fae);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)this_00,(char *)in_RDI,(int)((ulong)pQVar4 >> 0x20),
                   (char *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
                   (char *)0x378fc4);
        QMessageLogger::debug();
        pQVar6 = QDebug::operator<<((QDebug *)CONCAT44(iVar8,in_stack_ffffffffffffff08),
                                    (char *)in_stack_ffffffffffffff38);
        QDebug::QDebug((QDebug *)&stack0xffffffffffffff68,pQVar6);
        ::operator<<((QDebug *)in_stack_ffffffffffffff70.stream,
                     (QWidget *)in_stack_ffffffffffffff68.stream);
        pQVar6 = QDebug::operator<<((QDebug *)CONCAT44(iVar8,in_stack_ffffffffffffff08),
                                    (char *)in_stack_ffffffffffffff38);
        QDebug::QDebug(&local_88,pQVar6);
        in_stack_ffffffffffffff38 = this_00;
        anon_unknown.dwarf_2490c2::operator<<
                  (in_stack_ffffffffffffff28,(WidgetAttributes *)attributes);
        QDebug::~QDebug(&local_80);
        QDebug::~QDebug(&local_88);
        QDebug::~QDebug((QDebug *)&stack0xffffffffffffff70);
        QDebug::~QDebug((QDebug *)&stack0xffffffffffffff68);
        QDebug::~QDebug(&local_a0);
        local_20 = (undefined1 *)((ulong)local_20 & 0xffffffffffffff00);
      }
      pQVar7 = QWidget::windowHandle((QWidget *)pQVar4);
      if ((pQVar7 != (QWindow *)0x0) &&
         (bVar2 = QWidget::testAttribute((QWidget *)in_RDI,(WidgetAttribute)((ulong)pQVar4 >> 0x20))
         , !bVar2)) {
        QWidget::setAttribute
                  (in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                   (bool)in_stack_ffffffffffffff53);
      }
      bVar2 = QWidget::isWindow((QWidget *)pQVar4);
      if ((!bVar2) &&
         (bVar2 = QWidget::testAttribute((QWidget *)in_RDI,(WidgetAttribute)((ulong)pQVar4 >> 0x20))
         , !bVar2)) {
        if ((bVar1 & 1) == 0) {
          bVar2 = QWidget::testAttribute((QWidget *)in_RDI,(WidgetAttribute)((ulong)pQVar4 >> 0x20))
          ;
          if (bVar2) {
            QWidget::d_func((QWidget *)0x37918b);
            show_recursive(pQVar4);
          }
          else {
            pQVar4 = QWidget::d_func((QWidget *)0x37919f);
            *(uint *)&pQVar4->field_0x250 = *(uint *)&pQVar4->field_0x250 & 0x7fffffff | 0x80000000;
            (**(code **)(*(long *)this_00 + 0x68))(this_00,1);
            pQVar4 = QWidget::d_func((QWidget *)0x3791d1);
            *(uint *)&pQVar4->field_0x250 = *(uint *)&pQVar4->field_0x250 & 0x7fffffff;
          }
        }
        else {
          QWidget::setAttribute
                    (in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                     (bool)in_stack_ffffffffffffff53);
          QWidget::d_func((QWidget *)0x379122);
          showChildren((QWidgetPrivate *)CONCAT17(bVar1,in_stack_ffffffffffffff18),
                       SUB81((ulong)pQVar3 >> 0x38,0));
          in_stack_ffffffffffffff28 = (QDebug *)&DAT_aaaaaaaaaaaaaaaa;
          QShowEvent::QShowEvent((QShowEvent *)&stack0xffffffffffffff28);
          QCoreApplication::sendSpontaneousEvent
                    (&this_00->super_QObject,(QEvent *)&stack0xffffffffffffff28);
          QShowEvent::~QShowEvent((QShowEvent *)&stack0xffffffffffffff28);
        }
      }
    }
    iVar8 = iVar8 + 1;
  }
  QList<QObject_*>::~QList((QList<QObject_*> *)0x379207);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::showChildren(bool spontaneous)
{
    Q_Q(QWidget);
    qCDebug(lcWidgetShowHide) << "Showing children of" << q
                              << "spontaneously" << spontaneous;

    QList<QObject*> childList = children;
    for (int i = 0; i < childList.size(); ++i) {
        QWidget *widget = qobject_cast<QWidget*>(childList.at(i));
        if (!widget)
            continue;
        qCDebug(lcWidgetShowHide) << "Considering" << widget
              << "with attributes" << WidgetAttributes{widget};
        if (widget->windowHandle() && !widget->testAttribute(Qt::WA_WState_ExplicitShowHide))
            widget->setAttribute(Qt::WA_WState_Hidden, false);
        if (widget->isWindow() || widget->testAttribute(Qt::WA_WState_Hidden))
            continue;
        if (spontaneous) {
            widget->setAttribute(Qt::WA_Mapped);
            widget->d_func()->showChildren(true);
            QShowEvent e;
            QApplication::sendSpontaneousEvent(widget, &e);
        } else {
            if (widget->testAttribute(Qt::WA_WState_ExplicitShowHide)) {
                widget->d_func()->show_recursive();
            } else {
                // Call QWidget::setVisible() here, so that subclasses
                // that (wrongly) override setVisible to do initialization
                // will still be notified that they are made visible, but
                // do so without triggering ExplicitShowHide.
                widget->d_func()->dontSetExplicitShowHide = true;
                widget->setVisible(true);
                widget->d_func()->dontSetExplicitShowHide = false;
            }
        }
    }
}